

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpTransfer.cpp
# Opt level: O1

int __thiscall CFtpTransfer::Receive(CFtpTransfer *this,int client_sockfd)

{
  ssize_t sVar1;
  size_t sVar2;
  CFtpTransfer *this_00;
  CCommand *pCVar3;
  int in_ECX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBP;
  CFtpTransfer *this_01;
  char buffer [4096];
  string local_1058;
  
  this_00 = (CFtpTransfer *)&stack0xffffffffffffefc8;
  this_01 = this_00;
  bzero(this_00,0x1000);
  sVar1 = ReceiveLine(this_01,client_sockfd,(char *)this_00,in_ECX);
  if (0 < sVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"From client command: ",0x15);
    sVar2 = strlen(&stack0xffffffffffffefc8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,&stack0xffffffffffffefc8,sVar2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    this_00 = (CFtpTransfer *)CManageClient::FindClient(&this->m_ClientManager,client_sockfd);
    unaff_RBP = &local_1058.field_2;
    local_1058._M_dataplus._M_p = (pointer)unaff_RBP;
    sVar2 = strlen(&stack0xffffffffffffefc8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1058,&stack0xffffffffffffefc8,&stack0xffffffffffffefc8 + sVar2);
    pCVar3 = CManageClient::FindCommand(&this->m_ClientManager,&local_1058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != unaff_RBP) {
      operator_delete(local_1058._M_dataplus._M_p);
    }
    if (pCVar3 == (CCommand *)0x0) goto LAB_0010649e;
    (*pCVar3->_vptr_CCommand[1])(pCVar3,this_00);
    CClient::GetClientState((CClient *)this_00);
  }
  CManageClient::EarseClient(&this->m_ClientManager,client_sockfd);
LAB_0010649e:
  sVar1 = CClient::sendErrorMsg((CClient *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != unaff_RBP) {
    operator_delete(local_1058._M_dataplus._M_p);
  }
  _Unwind_Resume(sVar1);
}

Assistant:

int CFtpTransfer::Receive(const int client_sockfd) {
    long int n;
    char buffer[BUFFER_SIZE];
    bzero(buffer,BUFFER_SIZE);
    n = ReceiveLine(client_sockfd,buffer,BUFFER_SIZE);
    if(n > 0){
        cout << "From client command: " << buffer << endl;
        CClient *pClient = m_ClientManager.FindClient(client_sockfd);
        if(pClient){
            CCommand *pCommand = m_ClientManager.FindCommand(string(buffer));
            if(pCommand){
                pCommand->doWhat(pClient);
                EFTPSTATE state = pClient->GetClientState();
                if(state == QUIT){
                    m_ClientManager.EarseClient(client_sockfd);
                    m_CurrentConnetions--;
                    //cout << "one con disconnected and current con is: " << m_CurrentConnetions << endl;
                }
            }
            else{
                pClient->sendErrorMsg();
            }
        }
    }
    else{
        m_ClientManager.EarseClient(client_sockfd);
        m_CurrentConnetions--;
        //cout << "one con disconnected and current con is: " << m_CurrentConnetions << endl;
    }
}